

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O1

int archive_write_set_format_ar(archive_write *a)

{
  int iVar1;
  undefined8 *puVar2;
  
  if (a->format_free != (_func_int_archive_write_ptr *)0x0) {
    (*a->format_free)(a);
  }
  puVar2 = (undefined8 *)malloc(0x28);
  if (puVar2 == (undefined8 *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate ar data");
    iVar1 = -0x1e;
  }
  else {
    puVar2[2] = 0;
    puVar2[3] = 0;
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[4] = 0;
    a->format_data = puVar2;
    a->format_name = "ar";
    a->format_write_header = archive_write_ar_header;
    a->format_write_data = archive_write_ar_data;
    a->format_close = archive_write_ar_close;
    a->format_free = archive_write_ar_free;
    a->format_finish_entry = archive_write_ar_finish_entry;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
archive_write_set_format_ar(struct archive_write *a)
{
	struct ar_w *ar;

	/* If someone else was already registered, unregister them. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	ar = (struct ar_w *)malloc(sizeof(*ar));
	if (ar == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Can't allocate ar data");
		return (ARCHIVE_FATAL);
	}
	memset(ar, 0, sizeof(*ar));
	a->format_data = ar;

	a->format_name = "ar";
	a->format_write_header = archive_write_ar_header;
	a->format_write_data = archive_write_ar_data;
	a->format_close = archive_write_ar_close;
	a->format_free = archive_write_ar_free;
	a->format_finish_entry = archive_write_ar_finish_entry;
	return (ARCHIVE_OK);
}